

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

PROPERTIES_HANDLE properties_clone(PROPERTIES_HANDLE value)

{
  PROPERTIES_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (PROPERTIES_HANDLE)malloc(8);
  if (__ptr != (PROPERTIES_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (PROPERTIES_HANDLE)0x0;
}

Assistant:

PROPERTIES_HANDLE properties_clone(PROPERTIES_HANDLE value)
{
    PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)malloc(sizeof(PROPERTIES_INSTANCE));
    if (properties_instance != NULL)
    {
        properties_instance->composite_value = amqpvalue_clone(((PROPERTIES_INSTANCE*)value)->composite_value);
        if (properties_instance->composite_value == NULL)
        {
            free(properties_instance);
            properties_instance = NULL;
        }
    }

    return properties_instance;
}